

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<int>::Insert_Parent(BpTree<int> *this,IndexNode<int> *C,int k,IndexNode<int> *D)

{
  vector<char,_std::allocator<char>_> *__x;
  vector<Addr,_std::allocator<Addr>_> *pvVar1;
  vector<int,_std::allocator<int>_> *__x_00;
  vector<char,_std::allocator<char>_> *pvVar2;
  Addr *pAVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  uint uVar8;
  Addr *pAVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  IndexNode<int> *pIVar14;
  ulong uVar15;
  ulong uVar16;
  vector<int,_std::allocator<int>_> *__x_01;
  size_t sVar17;
  IndexNode<int> P;
  Ext_IndexNode<int> T;
  IndexNode<int> Q;
  IndexNode<int> E;
  IndexNode<int> local_650;
  vector<Addr,_std::allocator<Addr>_> *local_5f0;
  vector<Addr,_std::allocator<Addr>_> *local_5e8;
  int local_5dc;
  Ext_IndexNode<int> local_5d8;
  vector<int,_std::allocator<int>_> *local_590;
  vector<char,_std::allocator<char>_> *local_588;
  IndexNode<int> *local_580;
  ulong local_578;
  IndexNode<int> local_570;
  IndexNode<int> local_510;
  IndexNode<int> local_4b0;
  IndexNode<int> local_450;
  IndexNode<int> local_3f0;
  char local_390;
  vector<int,_std::allocator<int>_> local_388;
  vector<char,_std::allocator<char>_> local_370;
  vector<Addr,_std::allocator<Addr>_> local_358;
  Addr local_340;
  Addr AStack_338;
  char local_330;
  vector<int,_std::allocator<int>_> local_328;
  vector<char,_std::allocator<char>_> local_310;
  vector<Addr,_std::allocator<Addr>_> local_2f8;
  Addr local_2e0;
  Addr AStack_2d8;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  IndexNode<int> local_210;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  IndexNode<int> local_f0;
  char local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  local_330 = C->NodeState;
  __x_01 = &C->k;
  std::vector<int,_std::allocator<int>_>::vector(&local_328,__x_01);
  __x = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_310,__x);
  pvVar1 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2f8,pvVar1);
  local_2e0 = C->parent;
  AStack_2d8 = C->self;
  Buffer::Lock(&blocks,AStack_2d8.BlockNum);
  if (local_2f8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_390 = D->NodeState;
  __x_00 = &D->k;
  std::vector<int,_std::allocator<int>_>::vector(&local_388,__x_00);
  pvVar2 = &D->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_370,pvVar2);
  local_5f0 = &D->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_358,local_5f0);
  local_340 = D->parent;
  AStack_338 = D->self;
  Buffer::Lock(&blocks,AStack_338.BlockNum);
  if (local_358.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_370.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_370.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_90 = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_70,__x);
  local_5e8 = pvVar1;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,pvVar1);
  pAVar9 = &C->parent;
  local_40 = *pAVar9;
  AStack_38 = C->self;
  iVar5 = local_40.FileOff;
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pAVar3 = &D->parent;
  if (iVar5 == -1) {
    IndexNode<int>::IndexNode(&local_650,this->N);
    local_650.NodeState = '0';
    local_650.parent.BlockNum = -1;
    local_650.parent.FileOff = -1;
    *local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = k;
    *local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = '1';
    *local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
     _M_start = C->self;
    local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = D->self;
    InsertNode(this,&local_650);
    C->parent = local_650.self;
    this->RootAddr = local_650.self;
    *pAVar3 = local_650.self;
    local_f0.NodeState = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_f0.k,__x_01);
    std::vector<char,_std::allocator<char>_>::vector(&local_f0.v,__x);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_f0.p,local_5e8);
    local_f0.parent = *pAVar9;
    local_f0.self = C->self;
    UpdateBlock(this,&local_f0);
    if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_150.NodeState = D->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_150.k,__x_00);
    std::vector<char,_std::allocator<char>_>::vector(&local_150.v,pvVar2);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_150.p,local_5f0);
    local_150.parent = *pAVar3;
    local_150.self = D->self;
    UpdateBlock(this,&local_150);
    if (local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_3f0.NodeState = local_650.NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_3f0.k,&local_650.k);
    local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              (&local_3f0.v.super__Vector_base<char,_std::allocator<char>_>,
               (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    pcVar7 = local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar17 = (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar17 != 0) {
      memmove(local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,
              local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,sVar17);
    }
    local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar7 + sVar17;
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_3f0.p,&local_650.p);
    local_3f0.parent = local_650.parent;
    local_3f0.self = local_650.self;
    UpdateBlock(this,&local_3f0);
    if (local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if (local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
    }
    goto joined_r0x0012eaac;
  }
  IndexNode<int>::IndexNode(&local_650,this->N);
  FindNode(this,*pAVar9,&local_650);
  pvVar1 = local_5e8;
  uVar12 = this->N;
  if (local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar12 + -1].FileOff != -1) {
    Ext_IndexNode<int>::Ext_IndexNode(&local_5d8,uVar12);
    if ((long)this->N < 2) {
      lVar13 = (long)this->N + -1;
    }
    else {
      lVar10 = 0;
      do {
        local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] =
             local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
        local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] =
             local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
        local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = '0';
        local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] =
             local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
        local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10].BlockNum = -1;
        local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10].FileOff = -1;
        lVar10 = lVar10 + 1;
        lVar13 = (long)this->N + -1;
      } while (lVar10 < lVar13);
    }
    local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar13] =
         local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
         ._M_start[lVar13];
    iVar5 = this->N;
    local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)iVar5 + -1].BlockNum = -1;
    local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)iVar5 + -1].FileOff = -1;
    iVar5 = this->N;
    local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar5].BlockNum = -1;
    local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar5].FileOff = -1;
    uVar12 = this->N;
    if ((int)uVar12 < 0) {
      uVar16 = 0;
LAB_0012eb87:
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)uVar12 + 1;
      uVar16 = 0;
      do {
        if (local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16].FileOff == (C->self).FileOff)
        goto LAB_0012eb67;
        uVar16 = uVar16 + 1;
      } while (uVar11 != uVar16);
      uVar16 = uVar11 & 0xffffffff;
LAB_0012eb67:
      if ((int)uVar12 < 0) goto LAB_0012eb87;
      uVar15 = 0;
      do {
        if (local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15].FileOff == -1) {
          uVar11 = uVar15 & 0xffffffff;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
    }
    uVar12 = (int)uVar16 + 1;
    if ((int)uVar12 < (int)uVar11) {
      lVar13 = (long)(int)uVar11;
      do {
        local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar13 + -1] =
             local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13 + -2];
        local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar13 + -1] =
             local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13 + -2];
        local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar13] =
             local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13 + -1];
        lVar13 = lVar13 + -1;
      } while ((int)uVar12 < lVar13);
    }
    local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar16 & 0xffffffff] = '1';
    local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar16 & 0xffffffff] = k;
    local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar12] = D->self;
    IndexNode<int>::IndexNode(&local_510,this->N);
    iVar5 = this->N;
    if ((int)(iVar5 / 2 + (uint)((int)(iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU) < iVar5) + -1) < 1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] =
             local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
        local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] =
             local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
        local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] =
             local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
        uVar11 = uVar11 + 1;
        iVar5 = this->N;
      } while ((long)uVar11 <
               (long)(int)(iVar5 / 2 + (uint)((int)(iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU) < iVar5)
                          + -1));
    }
    uVar15 = uVar11 & 0xffffffff;
    local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar15] =
         local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
         ._M_start[uVar15];
    local_5dc = local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15];
    uVar8 = (int)uVar11 + 1;
    uVar12 = this->N;
    uVar11 = (ulong)uVar12;
    if ((int)uVar8 < (int)uVar12) {
      do {
        uVar12 = ((uint)(uVar11 >> 0x1f) & 1) + (int)uVar11;
        iVar6 = (int)uVar15;
        local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)((iVar6 - ((uint)((int)(uVar12 & 0xfffffffe) < (int)uVar11) +
                                ((int)uVar12 >> 1))) + 1)] =
             local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15 + 1];
        iVar5 = this->N;
        local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)((iVar6 - ((uint)((int)(iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU) < iVar5) +
                                iVar5 / 2)) + 1)] =
             local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15 + 1];
        iVar5 = this->N;
        local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)((iVar6 - ((uint)((int)(iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU) < iVar5) +
                                iVar5 / 2)) + 1)] =
             local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15 + 1];
        uVar12 = this->N;
        uVar11 = (ulong)(int)uVar12;
        uVar4 = uVar15 + 1;
        lVar13 = uVar15 + 2;
        uVar15 = uVar4;
      } while (lVar13 < (long)uVar11);
      uVar8 = (int)uVar4 + 1;
    }
    local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)((uVar8 - (int)uVar12 / 2) -
                  (uint)((int)(uVar12 - ((int)uVar12 >> 0x1f) & 0xfffffffe) < (int)uVar12))] =
         local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
         ._M_start[uVar8];
    local_510.NodeState = '0';
    local_590 = __x_00;
    InsertNode(this,&local_510);
    local_588 = pvVar2;
    local_580 = D;
    uVar11 = (ulong)(uint)this->N;
    if (0 < this->N) {
      lVar13 = 0;
      local_578 = uVar16;
      do {
        if (local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13].FileOff == -1) break;
        if (local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13].FileOff == (C->self).FileOff) {
          *pAVar9 = local_510.self;
        }
        else {
          IndexNode<int>::IndexNode(&local_4b0,(int)uVar11);
          FindNode(this,local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13],&local_4b0);
          local_4b0.parent = local_510.self;
          local_570.NodeState = local_4b0.NodeState;
          std::vector<int,_std::allocator<int>_>::vector(&local_570.k,&local_4b0.k);
          local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                    (&local_570.v.super__Vector_base<char,_std::allocator<char>_>,
                     (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          pcVar7 = local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar17 = (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (sVar17 != 0) {
            memmove(local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,sVar17);
          }
          local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar7 + sVar17;
          std::vector<Addr,_std::allocator<Addr>_>::vector(&local_570.p,&local_4b0.p);
          local_570.parent = local_4b0.parent;
          local_570.self = local_4b0.self;
          UpdateBlock(this,&local_570);
          if (local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar16 = local_578;
          if (local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        lVar13 = lVar13 + 1;
        uVar11 = (ulong)this->N;
      } while (lVar13 < (long)uVar11);
    }
    uVar12 = ((uint)(uVar11 >> 0x1f) & 1) + (int)uVar11;
    pIVar14 = &local_510;
    if ((int)uVar16 <
        (int)(((int)uVar12 >> 1) + (uint)((int)(uVar12 & 0xfffffffe) < (int)uVar11) + -1)) {
      pIVar14 = &local_650;
    }
    *pAVar3 = pIVar14->self;
    local_270.NodeState = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_270.k,__x_01);
    pIVar14 = local_580;
    pvVar2 = local_588;
    pvVar1 = local_5f0;
    std::vector<char,_std::allocator<char>_>::vector(&local_270.v,__x);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_270.p,local_5e8);
    local_270.parent = *pAVar9;
    local_270.self = C->self;
    UpdateBlock(this,&local_270);
    if (local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_2d0.NodeState = pIVar14->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_2d0.k,local_590);
    std::vector<char,_std::allocator<char>_>::vector(&local_2d0.v,pvVar2);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,pvVar1);
    local_2d0.parent = *pAVar3;
    local_2d0.self = D->self;
    UpdateBlock(this,&local_2d0);
    if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Insert_Parent(this,&local_650,local_5dc,&local_510);
    if (local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5d8.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_5d8.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    goto joined_r0x0012eaac;
  }
  if ((int)uVar12 < 1) {
    uVar8 = 0;
LAB_0012eb90:
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      if (local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16].FileOff == (C->self).FileOff) goto LAB_0012eae0;
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
    uVar16 = (ulong)uVar12;
LAB_0012eae0:
    uVar8 = (uint)uVar16;
    if ((int)uVar12 < 1) goto LAB_0012eb90;
    uVar16 = 0;
    do {
      if (local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16].FileOff == -1) goto LAB_0012eb92;
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
    uVar16 = (ulong)uVar12;
  }
LAB_0012eb92:
  uVar12 = uVar8 + 1;
  if ((int)uVar12 < (int)uVar16) {
    lVar13 = (long)(int)uVar16;
    do {
      local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13 + -1] =
           local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13 + -2];
      local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13 + -1] =
           local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar13 + -2];
      local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] =
           local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13 + -1];
      lVar13 = lVar13 + -1;
    } while ((int)uVar12 < lVar13);
  }
  local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar8] = '1';
  local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [uVar8] = k;
  local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar12] = D->self;
  local_650.NodeState = '0';
  D->parent = local_650.self;
  local_1b0.NodeState = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b0.k,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_1b0.v,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1b0.p,pvVar1);
  local_1b0.parent = *pAVar9;
  local_1b0.self = C->self;
  UpdateBlock(this,&local_1b0);
  if (local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_210.NodeState = D->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_210.k,__x_00);
  std::vector<char,_std::allocator<char>_>::vector(&local_210.v,pvVar2);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_210.p,local_5f0);
  local_210.parent = *pAVar3;
  local_210.self = D->self;
  UpdateBlock(this,&local_210);
  if (local_210.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_450.NodeState = local_650.NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_450.k,&local_650.k);
  local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_450.v.super__Vector_base<char,_std::allocator<char>_>,
             (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar7 = local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar17 = (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar17 != 0) {
    memmove(local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,
            local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar17);
  }
  local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar7 + sVar17;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_450.p,&local_650.p);
  local_450.parent = local_650.parent;
  local_450.self = local_650.self;
  UpdateBlock(this,&local_450);
  if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if (local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  }
joined_r0x0012eaac:
  if (local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5d8.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (Addr *)0x0) {
    operator_delete(local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_650.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_650.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_650.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::Insert_Parent(IndexNode<K>& C, K k, IndexNode<K> & D) {
	this->LockNode(C);
	this->LockNode(D);
	int i, j, pos;
	Addr C_Addr = C.self;
	if (this->IsRoot(C)) {
		IndexNode<K> R(N);		//C������Ǹ�
		R.NodeState = INTERNAL;
		R.parent = { -1, -1 };
		R.k[0] = k;
		R.v[0] = '1';
		R.p[0] = C.self;
		R.p[1] = D.self;

		this->InsertNode(R);
		C.parent = R.self;
		this->RootAddr = R.self;
		D.parent = R.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(R);
		return;
	}
	//C���Ǹ�
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	if (P.p[N - 1].FileOff == -1) {
		for (pos = 0; pos < N && P.p[pos].FileOff != C.self.FileOff; pos++);	//P���п�λ
		for (i = 0; i < N && P.p[i].FileOff != -1; i++);
		for (j = i; j > pos + 1; j--) {
			P.v[j - 1] = P.v[j - 2];
			P.k[j - 1] = P.k[j - 2];
			P.p[j] = P.p[j - 1];
		}
		P.v[pos] = '1';
		P.k[pos] = k;
		P.p[pos + 1] = D.self;
		P.NodeState = INTERNAL;
		//C�ĸ���㲻�øı�
		D.parent = P.self;
		this->UpdateBlock(C);
		this->UpdateBlock(D);
		this->UpdateBlock(P);
		return;
	}
	//Pû�п�λ
	Ext_IndexNode<K> T = Ext_IndexNode<K>(N);
	//����P��T�У�˳�����P
	for (i = 0; i < N-1; i++) {
		T.k[i] = P.k[i];
		T.v[i] = P.v[i];	P.v[i] = '0';
		T.p[i] = P.p[i];	P.p[i] = { -1, -1 };
	}
	T.p[N - 1] = P.p[N - 1];	P.p[N - 1] = { -1, -1 };
	T.p[N] = { -1, -1 };
	//�����µ�һ��
	for (pos = 0; pos < N + 1 && T.p[pos].FileOff != C.self.FileOff; pos++);
	for (i = 0; i < N + 1 && T.p[i].FileOff != -1; i++);
	for (j = i; j > pos+1; j--) {
		T.v[j - 1] = T.v[j - 2];
		T.k[j - 1] = T.k[j - 2];
		T.p[j] = T.p[j - 1];
	}
	T.v[pos] = '1';
	T.k[pos] = k;		//pos�ڲ���P�����Ͳ�Ľ��ѡ˭Ϊ�����
	T.p[pos + 1] = D.self;
	IndexNode<K> Q(N);
	//���¶�P��Q��ֵ
	for (i = 0; i < MIN_POINTS_NONLEAF - 1; i++) {
		P.k[i] = T.k[i];
		P.v[i] = T.v[i];
		P.p[i] = T.p[i];
	}
	P.p[i] = T.p[i];	//i == MIN_POINTS_NONLEAF - 1
	K k2 = T.k[i];
	i++;				//i == MIN_POINTS_NONLEAF
	for (; i < N; i++) {
		Q.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		Q.v[i - MIN_POINTS_NONLEAF] = T.v[i];
	}
	Q.p[i - MIN_POINTS_NONLEAF] = T.p[i];	//i == N
	Q.NodeState = INTERNAL;
	this->InsertNode(Q);
	//�Գ�ΪQ���ӽ�㣬�����丸����ַ
	for (i = 0; i < N && Q.p[i].FileOff != -1; i++) {
		if (Q.p[i].FileOff == C.self.FileOff) {
			C.parent = Q.self;
		}
		else {
			IndexNode<K> E(N);
			this->FindNode(Q.p[i], E);
			E.parent = Q.self;
			this->UpdateBlock(E);
		}
	}
	if (pos < MIN_POINTS_NONLEAF - 1) {
		D.parent = P.self;
	}
	else {
		D.parent = Q.self;
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->Insert_Parent(P, k2, Q);		//�����ݹ�
}